

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O0

void __thiscall Population::mutation(Population *this,double mutation_rate)

{
  int iVar1;
  size_type sVar2;
  reference this_00;
  undefined1 auVar3 [16];
  __normal_iterator<Chromosome_*,_std::vector<Chromosome,_std::allocator<Chromosome>_>_> local_38;
  iterator r;
  iterator current;
  long size;
  double mutation_count;
  double mutation_rate_local;
  Population *this_local;
  
  sVar2 = std::vector<Chromosome,_std::allocator<Chromosome>_>::size(&this->chromosomes);
  auVar3._8_4_ = (int)(sVar2 >> 0x20);
  auVar3._0_8_ = sVar2;
  auVar3._12_4_ = 0x45300000;
  size = (long)ceil(((auVar3._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)) * mutation_rate)
  ;
  sVar2 = std::vector<Chromosome,_std::allocator<Chromosome>_>::size(&this->chromosomes);
  r = std::vector<Chromosome,_std::allocator<Chromosome>_>::begin(&this->chromosomes);
  while( true ) {
    if (((double)size == 0.0) && (!NAN((double)size))) break;
    local_38._M_current = r._M_current;
    iVar1 = rand();
    std::
    advance<__gnu_cxx::__normal_iterator<Chromosome*,std::vector<Chromosome,std::allocator<Chromosome>>>,long>
              (&local_38,(long)iVar1 % (long)sVar2);
    this_00 = __gnu_cxx::
              __normal_iterator<Chromosome_*,_std::vector<Chromosome,_std::allocator<Chromosome>_>_>
              ::operator*(&local_38);
    Chromosome::mutate(this_00);
    size = (long)((double)size + -1.0);
  }
  return;
}

Assistant:

void Population::mutation(double mutation_rate) {
    /*
     *   Wahl der Mutationen innerhalb der Population
     *
     */
    double mutation_count = std::ceil((chromosomes.size() * mutation_rate ));
    //double mutation_count = chromosomes.size();

    long size = chromosomes.size();
    auto current = chromosomes.begin();

    while (mutation_count--) {
        auto r = current;
        std::advance(r, rand()%size);
        (*(r)).mutate();
    }


}